

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O1

Nwk_Vrt_t * Nwk_ManGraphListFindMin(Nwk_Grf_t *p,int List)

{
  Nwk_Vrt_t *pNVar1;
  Nwk_Vrt_t *pNVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  if (List == 0) {
    pNVar2 = (Nwk_Vrt_t *)0x0;
  }
  else {
    pNVar2 = p->pVerts[List];
  }
  if (pNVar2 == (Nwk_Vrt_t *)0x0) {
    return (Nwk_Vrt_t *)0x0;
  }
  iVar3 = 10000;
  iVar4 = 1000000;
  pNVar1 = (Nwk_Vrt_t *)0x0;
  while( true ) {
    if (0 < (long)pNVar2->nEdges) {
      lVar5 = 0;
      do {
        if ((pNVar1 == (Nwk_Vrt_t *)0x0) || (p->pVerts[(&pNVar2[1].Id)[lVar5]]->nEdges < iVar4)) {
          iVar4 = p->pVerts[(&pNVar2[1].Id)[lVar5]]->nEdges;
          pNVar1 = pNVar2;
        }
        lVar5 = lVar5 + 1;
      } while (pNVar2->nEdges != lVar5);
    }
    iVar3 = iVar3 + -1;
    if (iVar3 == 0) break;
    if ((long)pNVar2->iNext == 0) {
      pNVar2 = (Nwk_Vrt_t *)0x0;
    }
    else {
      pNVar2 = p->pVerts[pNVar2->iNext];
    }
    if (pNVar2 == (Nwk_Vrt_t *)0x0) {
      return pNVar1;
    }
  }
  return pNVar1;
}

Assistant:

Nwk_Vrt_t * Nwk_ManGraphListFindMin( Nwk_Grf_t * p, int List )
{
    Nwk_Vrt_t * pThis, * pMinCost = NULL;
    int k, Counter = 10000, BestCost = 1000000;
    Nwk_ListForEachVertex( p, List, pThis )
    {
        for ( k = 0; k < pThis->nEdges; k++ )
        {
            if ( pMinCost == NULL || BestCost > p->pVerts[pThis->pEdges[k]]->nEdges )
            {
                BestCost = p->pVerts[pThis->pEdges[k]]->nEdges;
                pMinCost = pThis;
            }
        }
        if ( --Counter == 0 )
            break;
    }
    return pMinCost;
}